

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXdr.cpp
# Opt level: O0

void anon_unknown.dwarf_2084ed::check<bool>(istream *is,bool c)

{
  byte bVar1;
  char *pcVar2;
  ostream *poVar3;
  void *this;
  byte in_SIL;
  bool v;
  bool *in_stack_ffffffffffffffe8;
  undefined6 in_stack_fffffffffffffff0;
  byte in_stack_fffffffffffffff6;
  
  bVar1 = in_SIL & 1;
  Imf_2_5::Xdr::read<(anonymous_namespace)::CharIO,std::istream>
            ((basic_istream<char,_std::char_traits<char>_> *)
             (CONCAT17(in_SIL,CONCAT16(in_stack_fffffffffffffff6,in_stack_fffffffffffffff0)) &
             0x1ffffffffffffff),in_stack_ffffffffffffffe8);
  pcVar2 = std::type_info::name((type_info *)&bool::typeinfo);
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar2);
  poVar3 = std::operator<<(poVar3,": expected ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(bool)(bVar1 & 1));
  poVar3 = std::operator<<(poVar3,", got ");
  this = (void *)std::ostream::operator<<(poVar3,(bool)(in_stack_fffffffffffffff6 & 1));
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  if ((bVar1 & 1) == (in_stack_fffffffffffffff6 & 1)) {
    return;
  }
  __assert_fail("c == v",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testXdr.cpp"
                ,0x85,"void (anonymous namespace)::check(istream &, T) [T = bool]");
}

Assistant:

void
check (istream &is, T c)
{
    T v;

    Xdr::read<CharIO> (is, v);
    cout << typeid(v).name() << ": expected " << c << ", got " << v << endl;
    assert (c == v);
}